

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header7.cpp
# Opt level: O3

KString * __thiscall
KDIS::PDU::Header7::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,Header7 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  ostream *poVar3;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  KStringStream ss;
  KString local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  Header6::GetAsString_abi_cxx11_(&local_1d0,&this->super_Header6);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a0,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  paVar1 = &local_1d0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if (0x47 < (this->super_Header6).m_ui8PDUType) goto LAB_002540c1;
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"PDU Status:\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a0,"\tCoupled Extension Indicator: ",0x1e);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  bVar2 = (this->super_Header6).m_ui8PDUType;
  if (((bVar2 - 0x17 < 0x2d) && ((0x10000004033fU >> ((ulong)(bVar2 - 0x17) & 0x3f) & 1) != 0)) ||
     (bVar2 == 1)) {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,"\tTransferred Entity Indicator: ",0x1f);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    bVar2 = (this->super_Header6).m_ui8PDUType;
  }
  if (((bVar2 - 0x17 < 0x31) && ((0x1f0000004033fU >> ((ulong)(bVar2 - 0x17) & 0x3f) & 1) != 0)) ||
     (bVar2 - 1 < 2)) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"\tLVC Indicator: ",0x10);
    DATA_TYPE::ENUMS::GetEnumAsStringLVCIndicator_abi_cxx11_
              (&local_1d0,(ENUMS *)(ulong)(*(uint *)&(this->super_Header6).field_0x24 >> 1 & 3),
               Value);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a0,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    if ((this->super_Header6).m_ui8PDUType != '\x02') goto LAB_00253f7c;
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,"\tDetonation Type Indicator: ",0x1c);
  }
  else {
LAB_00253f7c:
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"\tFire Type Indicator: ",0x16);
  }
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  bVar2 = (this->super_Header6).m_ui8PDUType;
  if (bVar2 - 0x19 < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,"\tRadio Attached Indicator: ",0x1b);
    DATA_TYPE::ENUMS::GetEnumAsStringAttachedIndicator_abi_cxx11_
              (&local_1d0,(ENUMS *)(ulong)((byte)(this->super_Header6).field_0x25 & 3),Value_00);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a0,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
LAB_00254068:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    bVar2 = (this->super_Header6).m_ui8PDUType;
  }
  else if (bVar2 - 0x1f < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,"\tIntercom Attached Indicator: ",0x1e);
    DATA_TYPE::ENUMS::GetEnumAsStringAttachedIndicator_abi_cxx11_
              (&local_1d0,(ENUMS *)(ulong)((byte)(this->super_Header6).field_0x25 & 3),Value_01);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a0,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    goto LAB_00254068;
  }
  if (bVar2 == 0x1c) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"\tSimulation Mode: ",0x12);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  }
LAB_002540c1:
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

KString Header7::GetAsString() const
{
    KStringStream ss;

    ss << Header6::GetAsString();

    // Append the status flags this PDU should have
    if( m_ui8PDUType < Attribute_PDU_Type )
    {
        //
        // CEI - Applies to every PDU except attribute
        //
        ss << "PDU Status:\n"
           << "\tCoupled Extension Indicator: " << ( KUINT16 )m_PDUStatusUnion.m_ui8PDUStatusCEI << "\n";

        //
        // TEI - Applies to various PDU
        //
        if( m_ui8PDUType == Entity_State_PDU_Type               ||
            m_ui8PDUType == Electromagnetic_Emission_PDU_Type   ||
            m_ui8PDUType == Designator_PDU_Type                 ||
            m_ui8PDUType == Transmitter_PDU_Type                ||
            m_ui8PDUType == Signal_PDU_Type                     ||
            m_ui8PDUType == Receiver_PDU_Type                   ||
            m_ui8PDUType == IFF_ATC_NAVAIDS_PDU_Type            ||
            m_ui8PDUType == IntercomSignal_PDU_Type             ||
            m_ui8PDUType == IntercomControl_PDU_Type            ||
            m_ui8PDUType == EnvironmentalProcess_PDU_Type       ||
            m_ui8PDUType == EntityStateUpdate_PDU_Type )
        {
            ss << "\tTransferred Entity Indicator: " << ( KUINT16 )m_PDUStatusUnion.m_ui8PDUStatusTEI << "\n";
        }

        //
        // LVC - Applies to various PDU
        //
        if( m_ui8PDUType == Entity_State_PDU_Type               ||
            m_ui8PDUType == Fire_PDU_Type                       ||
            m_ui8PDUType == Designator_PDU_Type                 ||
            m_ui8PDUType == Electromagnetic_Emission_PDU_Type   ||
            m_ui8PDUType == Transmitter_PDU_Type                ||
            m_ui8PDUType == Signal_PDU_Type                     ||
            m_ui8PDUType == Receiver_PDU_Type                   ||
            m_ui8PDUType == IFF_ATC_NAVAIDS_PDU_Type            ||
            m_ui8PDUType == IntercomSignal_PDU_Type             ||
            m_ui8PDUType == IntercomControl_PDU_Type            ||
            m_ui8PDUType == EnvironmentalProcess_PDU_Type       ||
            m_ui8PDUType == EntityStateUpdate_PDU_Type          ||
            m_ui8PDUType == DirectedEnergyFire_PDU_Type         ||
            m_ui8PDUType == EntityDamageStatus_PDU_Type         ||
            m_ui8PDUType == IO_Action_PDU_Type                  ||
            m_ui8PDUType == IO_Report_PDU_Type )
        {
            ss << "\tLVC Indicator: " << GetEnumAsStringLVCIndicator( m_PDUStatusUnion.m_ui8PDUStatusLVC ) << "\n";
        }

        //
        // FTI - Fire PDU only or DTI - Detonation PDU only
        //
        if( m_ui8PDUType != Fire_PDU_Type )
        {
            ss << "\tFire Type Indicator: " << ( KUINT16 )m_PDUStatusUnion.m_ui8PDUStatusFTI << "\n";
        }
        else if( m_ui8PDUType != Detonation_PDU_Type )
        {
            ss << "\tDetonation Type Indicator: " << ( KUINT16 )m_PDUStatusUnion.m_ui8PDUStatusDTI_RAI_IAI << "\n";
        }

        //
        // RAI - Transmitter(25), Signal(26), Receiver(27) or IAI  - IntercomSignal(31), IntercomControl(32)
        //
        if( m_ui8PDUType == Transmitter_PDU_Type  ||
            m_ui8PDUType == Signal_PDU_Type       ||
            m_ui8PDUType == Receiver_PDU_Type )
        {
            ss << "\tRadio Attached Indicator: " << GetEnumAsStringAttachedIndicator( m_PDUStatusUnion.m_ui8PDUStatusDTI_RAI_IAI ) << "\n";
        }
        else if( m_ui8PDUType == IntercomSignal_PDU_Type  ||
                 m_ui8PDUType == IntercomControl_PDU_Type )
        {
            ss << "\tIntercom Attached Indicator: " << GetEnumAsStringAttachedIndicator( m_PDUStatusUnion.m_ui8PDUStatusDTI_RAI_IAI ) << "\n";
        }

        //
        // SM - IFF ATC NAVAIDS(28) only
        //
        if( m_ui8PDUType == IFF_ATC_NAVAIDS_PDU_Type )
        {
            ss << "\tSimulation Mode: " << ( KUINT16 )m_PDUStatusUnion.m_ui8PDUStatusSM << "\n";
        }
    }

    return ss.str();
}